

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O2

Status __thiscall
sentencepiece::SentencePieceProcessor::NBestEncode
          (SentencePieceProcessor *this,string_view input,int nbest_size,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *pieces)

{
  void **ppvVar1;
  ostringstream *this_00;
  int iVar2;
  undefined4 in_register_0000000c;
  Status *_status;
  long lVar3;
  long *plVar4;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *in_R9;
  void **ppvVar5;
  long lVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  NBestSentencePieceText spt;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [24];
  int local_198;
  Rep *local_190;
  
  plVar4 = (long *)input._M_len;
  (**(code **)(*plVar4 + 0x38))();
  if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
    util::Status::~Status((Status *)this);
    if (in_R9 == (vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  *)0x0) {
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_4_ = 0xd;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"third_party/sentencepiece/src/sentencepiece_processor.cc")
      ;
      std::operator<<((ostream *)this_00,"(");
      std::ostream::operator<<(this_00,0x1b4);
      std::operator<<((ostream *)this_00,") [");
      std::operator<<((ostream *)this_00,"pieces");
      std::operator<<((ostream *)this_00,"] ");
      std::operator<<((ostream *)this_00,"output container is null");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    else {
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::clear((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_R9);
      NBestSentencePieceText::NBestSentencePieceText((NBestSentencePieceText *)local_1b0);
      (**(code **)(*plVar4 + 0xd0))
                (this,plVar4,input._M_str,CONCAT44(in_register_0000000c,nbest_size),
                 (ulong)pieces & 0xffffffff,local_1b0);
      if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
        util::Status::~Status((Status *)this);
        ppvVar5 = local_190->elements;
        if (local_190 == (Rep *)0x0) {
          ppvVar5 = (void **)0x0;
        }
        ppvVar1 = ppvVar5 + local_198;
        for (; ppvVar5 != ppvVar1; ppvVar5 = ppvVar5 + 1) {
          local_1c8 = 0;
          uStack_1c0 = 0;
          local_1b8 = 0;
          lVar6 = *(long *)((long)*ppvVar5 + 0x40);
          lVar3 = lVar6 + 8;
          if (lVar6 == 0) {
            lVar3 = 0;
          }
          iVar2 = *(int *)((long)*ppvVar5 + 0x38);
          for (lVar6 = 0; (long)iVar2 * 8 != lVar6; lVar6 = lVar6 + 8) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(ulong *)(*(long *)(lVar3 + lVar6) + 0x30) & 0xfffffffffffffffe));
          }
          std::
          vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    (in_R9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_1c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1c8);
        }
        util::Status::Status((Status *)this);
      }
      NBestSentencePieceText::~NBestSentencePieceText((NBestSentencePieceText *)local_1b0);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::NBestEncode(
    absl::string_view input, int nbest_size,
    std::vector<std::vector<std::string>> *pieces) const {
  CHECK_OR_RETURN_STATUS_STL(pieces);

  NBestSentencePieceText spt;
  RETURN_IF_ERROR(NBestEncode(input, nbest_size, &spt));
  for (const auto &nbest : spt.nbests()) {
    std::vector<std::string> result;
    for (const auto &sp : nbest.pieces()) {
      result.emplace_back(sp.piece());
    }
    pieces->emplace_back(result);
  }

  return util::OkStatus();
}